

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsRedcostFixing.cpp
# Opt level: O2

void __thiscall
HighsRedcostFixing::addRootRedcost
          (HighsRedcostFixing *this,HighsMipSolver *mipsolver,
          vector<double,_std::allocator<double>_> *lpredcost,double lpobjective)

{
  HighsMipSolverData *pHVar1;
  pointer pmVar2;
  HighsRedcostFixing *pHVar3;
  vector<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
  *pvVar4;
  iterator it;
  iterator iVar5;
  iterator iVar6;
  uint uVar7;
  int iVar8;
  iterator iVar9;
  long lVar10;
  long lVar11;
  _Self del;
  int iVar12;
  ulong uVar13;
  double dVar14;
  int local_8c;
  uint local_88;
  HighsInt lb;
  double requiredcutoffbound;
  HighsRedcostFixing *local_78;
  HighsMipSolver *local_70;
  vector<double,_std::allocator<double>_> *local_68;
  long local_60;
  vector<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
  *local_58;
  ulong local_50;
  double local_48;
  int *local_40;
  int *local_38;
  
  local_58 = &this->lurkingColLower;
  local_48 = lpobjective;
  std::
  vector<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
  ::resize(local_58,(long)mipsolver->model_->num_col_);
  local_78 = this;
  std::
  vector<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
  ::resize(&this->lurkingColUpper,(long)mipsolver->model_->num_col_);
  pHVar1 = (mipsolver->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
  HighsLpRelaxation::computeBasicDegenerateDuals(&pHVar1->lp,pHVar1->feastol,(HighsDomain *)0x0);
  pHVar1 = (mipsolver->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
  local_38 = *(int **)&(pHVar1->integral_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl
  ;
  local_40 = *(pointer *)
              ((long)&(pHVar1->integral_cols).super__Vector_base<int,_std::allocator<int>_> + 8);
  local_70 = mipsolver;
  local_68 = lpredcost;
  do {
    pHVar3 = local_78;
    if (local_38 == local_40) {
      return;
    }
    lVar10 = (long)*local_38;
    dVar14 = (lpredcost->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start[lVar10];
    pHVar1 = (mipsolver->mipdata_)._M_t.
             super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
             _M_t.
             super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
             super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
    local_60 = lVar10;
    if (dVar14 <= pHVar1->feastol) {
      if (dVar14 < -pHVar1->feastol) {
        lb = (HighsInt)
             *(double *)
              (*(long *)&(pHVar1->domain).col_upper_.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl + lVar10 * 8);
        if (dVar14 <= -INFINITY) {
          std::
          _Rb_tree<double,_std::pair<const_double,_int>,_std::_Select1st<std::pair<const_double,_int>_>,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
          ::clear(&(local_78->lurkingColUpper).
                   super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar10]._M_t);
          std::
          _Rb_tree<double,_std::pair<const_double,_int>,_std::_Select1st<std::pair<const_double,_int>_>,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
          ::clear(&(pHVar3->lurkingColLower).
                   super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar10]._M_t);
          pmVar2 = (pHVar3->lurkingColLower).
                   super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          goto LAB_002e1fcc;
        }
        dVar14 = *(double *)
                  (*(long *)&(pHVar1->domain).col_lower_.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl +
                  lVar10 * 8);
        local_8c = (int)(dVar14 + 1.5);
        if (dVar14 <= -INFINITY) {
          local_8c = lb + -0x400;
        }
        local_88 = (lb - local_8c) + 0x3ffU >> 10;
        if (lb - local_8c < 0x401) {
          local_88 = 1;
        }
        while (pvVar4 = local_58, local_8c <= lb) {
          pHVar1 = (mipsolver->mipdata_)._M_t.
                   super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                   .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
          dVar14 = pHVar1->feastol;
          requiredcutoffbound =
               ((dVar14 * 10.0 + (double)(~lb + local_8c)) *
                (lpredcost->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start[lVar10] + local_48) - dVar14;
          lVar11 = lVar10;
          iVar8 = local_8c;
          if (pHVar1->lower_bound <= requiredcutoffbound) {
            iVar5 = std::
                    _Rb_tree<double,_std::pair<const_double,_int>,_std::_Select1st<std::pair<const_double,_int>_>,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                    ::lower_bound(&(local_58->
                                   super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start[lVar10]._M_t,
                                  &requiredcutoffbound);
            iVar8 = local_8c;
            pmVar2 = (pvVar4->
                     super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            iVar12 = local_8c - local_88;
            for (iVar6 = iVar5;
                iVar6._M_node != &pmVar2[lVar10]._M_t._M_impl.super__Rb_tree_header._M_header;
                iVar6._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar6._M_node)) {
              lVar11 = local_60;
              mipsolver = local_70;
              lpredcost = local_68;
              if (iVar12 < *(int *)&iVar6._M_node[1]._M_parent) goto LAB_002e1e1f;
            }
            iVar5 = std::
                    _Rb_tree<double,std::pair<double_const,int>,std::_Select1st<std::pair<double_const,int>>,std::less<double>,std::allocator<std::pair<double_const,int>>>
                    ::_M_emplace_hint_equal<double&,int&>
                              ((_Rb_tree<double,std::pair<double_const,int>,std::_Select1st<std::pair<double_const,int>>,std::less<double>,std::allocator<std::pair<double_const,int>>>
                                *)(pmVar2 + lVar10),iVar5._M_node,&requiredcutoffbound,&local_8c);
            iVar6._M_node =
                 *(_Base_ptr *)
                  ((long)&(local_58->
                          super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start[lVar10]._M_t._M_impl.
                          super__Rb_tree_header + 0x10);
            while (iVar9._M_node = iVar6._M_node, iVar8 = local_8c, lVar11 = local_60,
                  mipsolver = local_70, lpredcost = local_68, iVar9._M_node != iVar5._M_node) {
              iVar12 = *(int *)&iVar9._M_node[1]._M_parent;
              iVar6._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar9._M_node);
              if (iVar12 <= iVar8) {
                std::
                _Rb_tree<double,std::pair<double_const,int>,std::_Select1st<std::pair<double_const,int>>,std::less<double>,std::allocator<std::pair<double_const,int>>>
                ::erase_abi_cxx11_((_Rb_tree<double,std::pair<double_const,int>,std::_Select1st<std::pair<double_const,int>>,std::less<double>,std::allocator<std::pair<double_const,int>>>
                                    *)((local_58->
                                       super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start + lVar10),iVar9);
              }
            }
          }
LAB_002e1e1f:
          lVar10 = lVar11;
          local_8c = iVar8 + local_88;
        }
      }
    }
    else {
      iVar8 = (int)*(double *)
                    (*(long *)&(pHVar1->domain).col_lower_.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl +
                    lVar10 * 8);
      lb = iVar8;
      if (INFINITY <= dVar14) {
        std::
        _Rb_tree<double,_std::pair<const_double,_int>,_std::_Select1st<std::pair<const_double,_int>_>,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
        ::clear(&(local_78->lurkingColUpper).
                 super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar10]._M_t);
        std::
        _Rb_tree<double,_std::pair<const_double,_int>,_std::_Select1st<std::pair<const_double,_int>_>,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
        ::clear(&(pHVar3->lurkingColLower).
                 super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar10]._M_t);
        pmVar2 = (pHVar3->lurkingColUpper).
                 super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
LAB_002e1fcc:
        requiredcutoffbound = -INFINITY;
        std::
        _Rb_tree<double,std::pair<double_const,int>,std::_Select1st<std::pair<double_const,int>>,std::less<double>,std::allocator<std::pair<double_const,int>>>
        ::_M_emplace_equal<double,int&>
                  ((_Rb_tree<double,std::pair<double_const,int>,std::_Select1st<std::pair<double_const,int>>,std::less<double>,std::allocator<std::pair<double_const,int>>>
                    *)((long)pmVar2 + lVar10 * 0x30),&requiredcutoffbound,&lb);
      }
      else {
        dVar14 = *(double *)
                  (*(long *)&(pHVar1->domain).col_upper_.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl +
                  lVar10 * 8);
        if (dVar14 < INFINITY) {
          dVar14 = floor(dVar14 + -0.5);
          local_88 = (uint)dVar14;
        }
        else {
          local_88 = iVar8 + 0x400;
        }
        uVar13 = (ulong)((local_88 - iVar8) + 0x3ff >> 10);
        lVar11 = lVar10;
        local_50 = uVar13;
        uVar7 = local_88;
        if ((int)(local_88 - iVar8) < 0x401) {
          uVar13 = 1;
          local_50 = uVar13;
        }
        for (; pHVar3 = local_78, local_8c = iVar8, iVar8 <= (int)uVar7; iVar8 = iVar8 + (int)uVar13
            ) {
          pHVar1 = (mipsolver->mipdata_)._M_t.
                   super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                   .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
          requiredcutoffbound =
               (pHVar1->feastol * -10.0 + (double)((iVar8 - lb) + 1)) *
               (lpredcost->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start[lVar11] + local_48;
          if (pHVar1->lower_bound <= requiredcutoffbound) {
            iVar5 = std::
                    _Rb_tree<double,_std::pair<const_double,_int>,_std::_Select1st<std::pair<const_double,_int>_>,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                    ::lower_bound(&(local_78->lurkingColUpper).
                                   super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[lVar10]._M_t,
                                  &requiredcutoffbound);
            iVar8 = local_8c;
            pmVar2 = (pHVar3->lurkingColUpper).
                     super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            iVar12 = (int)uVar13 + local_8c;
            for (iVar6 = iVar5;
                iVar6._M_node != (_Rb_tree_node_base *)((long)&pmVar2[lVar10]._M_t._M_impl + 8U);
                iVar6._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar6._M_node)) {
              lVar11 = local_60;
              mipsolver = local_70;
              lpredcost = local_68;
              uVar13 = local_50;
              uVar7 = local_88;
              if (*(int *)&iVar6._M_node[1]._M_parent < iVar12) goto LAB_002e1fa0;
            }
            iVar5 = std::
                    _Rb_tree<double,std::pair<double_const,int>,std::_Select1st<std::pair<double_const,int>>,std::less<double>,std::allocator<std::pair<double_const,int>>>
                    ::_M_emplace_hint_equal<double&,int&>
                              ((_Rb_tree<double,std::pair<double_const,int>,std::_Select1st<std::pair<double_const,int>>,std::less<double>,std::allocator<std::pair<double_const,int>>>
                                *)(pmVar2 + lVar10),iVar5._M_node,&requiredcutoffbound,&local_8c);
            iVar6._M_node =
                 *(_Base_ptr *)
                  ((long)&(local_78->lurkingColUpper).
                          super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar10]._M_t._M_impl + 0x18);
            while (iVar9._M_node = iVar6._M_node, iVar8 = local_8c, lVar11 = local_60,
                  mipsolver = local_70, lpredcost = local_68, uVar13 = local_50, uVar7 = local_88,
                  iVar9._M_node != iVar5._M_node) {
              iVar12 = *(int *)&iVar9._M_node[1]._M_parent;
              iVar6._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar9._M_node);
              if (iVar8 <= iVar12) {
                std::
                _Rb_tree<double,std::pair<double_const,int>,std::_Select1st<std::pair<double_const,int>>,std::less<double>,std::allocator<std::pair<double_const,int>>>
                ::erase_abi_cxx11_((_Rb_tree<double,std::pair<double_const,int>,std::_Select1st<std::pair<double_const,int>>,std::less<double>,std::allocator<std::pair<double_const,int>>>
                                    *)((local_78->lurkingColUpper).
                                       super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + lVar10),iVar9);
              }
            }
          }
LAB_002e1fa0:
        }
      }
    }
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

void HighsRedcostFixing::addRootRedcost(const HighsMipSolver& mipsolver,
                                        const std::vector<double>& lpredcost,
                                        double lpobjective) {
  lurkingColLower.resize(mipsolver.numCol());
  lurkingColUpper.resize(mipsolver.numCol());

  mipsolver.mipdata_->lp.computeBasicDegenerateDuals(
      mipsolver.mipdata_->feastol);

  for (HighsInt col : mipsolver.mipdata_->integral_cols) {
    if (lpredcost[col] > mipsolver.mipdata_->feastol) {
      // col <= (cutoffbound - lpobj)/redcost + lb
      // so for lurkub = lb to ub - 1 we can compute the necessary cutoff
      // bound to reach this bound which is:
      //  lurkub = (cutoffbound - lpobj)/redcost + lb
      //  cutoffbound = (lurkub - lb) * redcost + lpobj
      HighsInt lb = (HighsInt)mipsolver.mipdata_->domain.col_lower_[col];

      if (lpredcost[col] == kHighsInf) {
        lurkingColUpper[col].clear();
        lurkingColLower[col].clear();
        lurkingColUpper[col].emplace(-kHighsInf, lb);
        continue;
      }

      HighsInt maxub;
      if (mipsolver.mipdata_->domain.col_upper_[col] == kHighsInf)
        maxub = lb + 1024;
      else
        maxub = (HighsInt)std::floor(
            mipsolver.mipdata_->domain.col_upper_[col] - 0.5);

      HighsInt step = 1;
      if (maxub - lb > 1024) step = (maxub - lb + 1023) >> 10;

      for (HighsInt lurkub = lb; lurkub <= maxub; lurkub += step) {
        double fracbound = (lurkub - lb + 1) - 10 * mipsolver.mipdata_->feastol;
        double requiredcutoffbound = fracbound * lpredcost[col] + lpobjective;
        if (requiredcutoffbound < mipsolver.mipdata_->lower_bound) continue;
        bool useful = true;

        // check if we already have a better lurking bound stored
        auto pos = lurkingColUpper[col].lower_bound(requiredcutoffbound);
        for (auto it = pos; it != lurkingColUpper[col].end(); ++it) {
          if (it->second < lurkub + step) {
            useful = false;
            break;
          }
        }

        if (!useful) continue;

        // we have no better lurking bound stored store this lurking bound and
        // check if it dominates one that is already stored
        auto it =
            lurkingColUpper[col].emplace_hint(pos, requiredcutoffbound, lurkub);

        auto i = lurkingColUpper[col].begin();
        while (i != it) {
          if (i->second >= lurkub) {
            auto del = i++;
            lurkingColUpper[col].erase(del);
          } else {
            ++i;
          }
        }
      }
    } else if (lpredcost[col] < -mipsolver.mipdata_->feastol) {
      // col >= (cutoffbound - lpobj)/redcost + ub
      // so for lurklb = lb + 1 to ub we can compute the necessary cutoff
      // bound to reach this bound which is:
      //  lurklb = (cutoffbound - lpobj)/redcost + ub
      //  cutoffbound = (lurklb - ub) * redcost + lpobj

      HighsInt ub = (HighsInt)mipsolver.mipdata_->domain.col_upper_[col];

      if (lpredcost[col] == -kHighsInf) {
        lurkingColUpper[col].clear();
        lurkingColLower[col].clear();
        lurkingColLower[col].emplace(-kHighsInf, ub);
        continue;
      }

      HighsInt minlb;
      if (mipsolver.mipdata_->domain.col_lower_[col] == -kHighsInf)
        minlb = ub - 1024;
      else
        minlb = (HighsInt)(mipsolver.mipdata_->domain.col_lower_[col] + 1.5);

      HighsInt step = 1;
      if (ub - minlb > 1024) step = (ub - minlb + 1023) >> 10;

      for (HighsInt lurklb = minlb; lurklb <= ub; lurklb += step) {
        double fracbound = (lurklb - ub - 1) + 10 * mipsolver.mipdata_->feastol;
        double requiredcutoffbound = fracbound * lpredcost[col] + lpobjective -
                                     mipsolver.mipdata_->feastol;
        if (requiredcutoffbound < mipsolver.mipdata_->lower_bound) continue;
        bool useful = true;

        // check if we already have a better lurking bound stored
        auto pos = lurkingColLower[col].lower_bound(requiredcutoffbound);
        for (auto it = pos; it != lurkingColLower[col].end(); ++it) {
          if (it->second > lurklb - step) {
            useful = false;
            break;
          }
        }

        if (!useful) continue;

        // we have no better lurking bound stored store this lurking bound and
        // check if it dominates one that is already stored
        auto it =
            lurkingColLower[col].emplace_hint(pos, requiredcutoffbound, lurklb);

        auto i = lurkingColLower[col].begin();
        while (i != it) {
          if (i->second <= lurklb) {
            auto del = i++;
            lurkingColLower[col].erase(del);
          } else {
            ++i;
          }
        }
      }
    }
  }
}